

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::unShift(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this)

{
  undefined8 *puVar1;
  uint *puVar2;
  undefined1 (*pauVar3) [16];
  pointer pnVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  type_conflict5 tVar9;
  bool bVar10;
  int iVar11;
  SPxOut *pSVar12;
  Status **ppSVar13;
  cpp_dec_float<50U,_int,_void> *pcVar14;
  cpp_dec_float<50U,_int,_void> *pcVar15;
  long lVar16;
  ulong uVar17;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps;
  cpp_dec_float<50U,_int,_void> local_178;
  cpp_dec_float<50U,_int,_void> *local_140;
  cpp_dec_float<50U,_int,_void> local_138;
  cpp_dec_float<50U,_int,_void> local_f8;
  ulong local_c0;
  cpp_dec_float<50U,_int,_void> local_b8;
  Status **local_78;
  Status **local_70;
  cpp_dec_float<50U,_int,_void> local_68;
  
  pSVar12 = this->spxout;
  if ((pSVar12 != (SPxOut *)0x0) &&
     (local_138.data._M_elems[0] = pSVar12->m_verbosity, 4 < (int)local_138.data._M_elems[0])) {
    local_f8.data._M_elems[0] = 5;
    (*pSVar12->_vptr_SPxOut[2])();
    pSVar12 = soplex::operator<<(this->spxout,"DSHIFT07 = ");
    pSVar12 = soplex::operator<<(pSVar12,"unshifting ...");
    std::endl<char,std::char_traits<char>>(pSVar12->m_streams[pSVar12->m_verbosity]);
    (*this->spxout->_vptr_SPxOut[2])();
  }
  if (this->initialized == true) {
    local_138.fpclass = cpp_dec_float_finite;
    local_138.prec_elem = 10;
    local_138.data._M_elems[0] = 0;
    local_138.data._M_elems[1] = 0;
    local_138.data._M_elems[2] = 0;
    local_138.data._M_elems[3] = 0;
    local_138.data._M_elems[4] = 0;
    local_138.data._M_elems[5] = 0;
    local_138.data._M_elems[6] = 0;
    local_138.data._M_elems[7] = 0;
    local_138.data._M_elems[8] = 0;
    local_138.data._M_elems[9] = 0;
    local_138.exp = 0;
    local_138.neg = false;
    local_f8.fpclass = cpp_dec_float_finite;
    local_f8.prec_elem = 10;
    local_f8.data._M_elems[0] = 0;
    local_f8.data._M_elems[1] = 0;
    local_f8.data._M_elems[2] = 0;
    local_f8.data._M_elems[3] = 0;
    local_f8.data._M_elems[4] = 0;
    local_f8.data._M_elems[5] = 0;
    local_f8.data._M_elems[6] = 0;
    local_f8.data._M_elems[7] = 0;
    local_f8.data._M_elems[8] = 0;
    local_f8.data._M_elems[9] = 0;
    local_f8.exp = 0;
    local_f8.neg = false;
    local_140 = &(this->theShift).m_backend;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(local_140,0);
    if (this->theType == ENTER) {
      entertol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_68,this);
      uVar17 = (ulong)(uint)(this->thecovectors->set).thenum;
      if (this->theRep == COLUMN) {
        lVar16 = uVar17 * 0x38;
        while( true ) {
          if ((int)uVar17 < 1) break;
          local_b8.data._M_elems._0_8_ =
               (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).theBaseId.data[uVar17 - 1].super_DataKey;
          iVar11 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::number(&this->
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ,(SPxId *)&local_b8);
          if ((int)local_b8.data._M_elems[0] < 0) {
            pnVar4 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .left.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_138.data._M_elems[0] = pnVar4[iVar11].m_backend.data._M_elems[0];
            local_138.data._M_elems[9] = pnVar4[iVar11].m_backend.data._M_elems[9];
            puVar2 = pnVar4[iVar11].m_backend.data._M_elems + 5;
            uVar5 = *(undefined8 *)puVar2;
            uVar6 = *(undefined8 *)(puVar2 + 2);
            puVar2 = pnVar4[iVar11].m_backend.data._M_elems + 1;
            uVar7 = *(undefined8 *)puVar2;
            uVar8 = *(undefined8 *)(puVar2 + 2);
            local_138.exp = pnVar4[iVar11].m_backend.exp;
            local_138.fpclass = pnVar4[iVar11].m_backend.fpclass;
            local_138.prec_elem = pnVar4[iVar11].m_backend.prec_elem;
            local_138.neg =
                 (bool)((local_138.data._M_elems[0] != 0 ||
                        local_138.fpclass != cpp_dec_float_finite) ^ pnVar4[iVar11].m_backend.neg);
            local_138.data._M_elems[5] = (uint)uVar5;
            local_138.data._M_elems[6] = (uint)((ulong)uVar5 >> 0x20);
            local_138.data._M_elems[7] = (uint)uVar6;
            local_138.data._M_elems[8] = (uint)((ulong)uVar6 >> 0x20);
            local_138.data._M_elems[1] = (uint)uVar7;
            local_138.data._M_elems[2] = (uint)((ulong)uVar7 >> 0x20);
            local_138.data._M_elems[3] = (uint)uVar8;
            local_138.data._M_elems[4] = (uint)((ulong)uVar8 >> 0x20);
            pnVar4 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .right.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_f8.data._M_elems[0] = pnVar4[iVar11].m_backend.data._M_elems[0];
            local_178.data._M_elems[8] = pnVar4[iVar11].m_backend.data._M_elems[9];
            puVar2 = pnVar4[iVar11].m_backend.data._M_elems + 5;
            local_178.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            uVar5 = *(undefined8 *)(puVar2 + 2);
            local_178.data._M_elems._24_5_ = SUB85(uVar5,0);
            local_178.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
            puVar2 = pnVar4[iVar11].m_backend.data._M_elems + 1;
            local_178.data._M_elems._0_16_ = *(undefined1 (*) [16])puVar2;
            local_f8.exp = pnVar4[iVar11].m_backend.exp;
            local_f8.fpclass = pnVar4[iVar11].m_backend.fpclass;
            local_f8.prec_elem = pnVar4[iVar11].m_backend.prec_elem;
            local_f8.neg = (bool)((local_f8.fpclass != cpp_dec_float_finite ||
                                  local_f8.data._M_elems[0] != 0) ^ pnVar4[iVar11].m_backend.neg);
            local_f8.data._M_elems[5] = local_178.data._M_elems[4];
            local_f8.data._M_elems[6] = local_178.data._M_elems[5];
            local_f8.data._M_elems[7] = (uint)uVar5;
            local_f8.data._M_elems[8] = (uint)((ulong)uVar5 >> 0x20);
            local_f8.data._M_elems[1] = (uint)*(undefined8 *)puVar2;
            local_f8.data._M_elems[2] = (uint)((ulong)*(undefined8 *)puVar2 >> 0x20);
            local_f8.data._M_elems[3] = (uint)*(undefined8 *)(puVar2 + 2);
            local_f8.data._M_elems[4] = (uint)((ulong)*(undefined8 *)(puVar2 + 2) >> 0x20);
            local_f8.data._M_elems[9] = local_178.data._M_elems[8];
          }
          else {
            pnVar4 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .up.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar5 = *(undefined8 *)(pnVar4[iVar11].m_backend.data._M_elems + 8);
            local_138.data._M_elems[8] = (uint)uVar5;
            local_138.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
            uVar5 = *(undefined8 *)&pnVar4[iVar11].m_backend.data;
            uVar6 = *(undefined8 *)(pnVar4[iVar11].m_backend.data._M_elems + 2);
            puVar2 = pnVar4[iVar11].m_backend.data._M_elems + 4;
            uVar7 = *(undefined8 *)puVar2;
            uVar8 = *(undefined8 *)(puVar2 + 2);
            local_138.data._M_elems[4] = (uint)uVar7;
            local_138.data._M_elems[5] = (uint)((ulong)uVar7 >> 0x20);
            local_138.data._M_elems[6] = (uint)uVar8;
            local_138.data._M_elems[7] = (uint)((ulong)uVar8 >> 0x20);
            local_138.data._M_elems[0] = (uint)uVar5;
            local_138.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
            local_138.data._M_elems[2] = (uint)uVar6;
            local_138.data._M_elems[3] = (uint)((ulong)uVar6 >> 0x20);
            local_138.exp = pnVar4[iVar11].m_backend.exp;
            local_138.neg = pnVar4[iVar11].m_backend.neg;
            local_138.fpclass = pnVar4[iVar11].m_backend.fpclass;
            local_138.prec_elem = pnVar4[iVar11].m_backend.prec_elem;
            pnVar4 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .low.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar5 = *(undefined8 *)(pnVar4[iVar11].m_backend.data._M_elems + 8);
            local_f8.data._M_elems[8] = (uint)uVar5;
            local_f8.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
            uVar5 = *(undefined8 *)&pnVar4[iVar11].m_backend.data;
            uVar6 = *(undefined8 *)(pnVar4[iVar11].m_backend.data._M_elems + 2);
            puVar2 = pnVar4[iVar11].m_backend.data._M_elems + 4;
            uVar7 = *(undefined8 *)puVar2;
            uVar8 = *(undefined8 *)(puVar2 + 2);
            local_f8.data._M_elems[4] = (uint)uVar7;
            local_f8.data._M_elems[5] = (uint)((ulong)uVar7 >> 0x20);
            local_f8.data._M_elems[6] = (uint)uVar8;
            local_f8.data._M_elems[7] = (uint)((ulong)uVar8 >> 0x20);
            local_f8.data._M_elems[0] = (uint)uVar5;
            local_f8.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
            local_f8.data._M_elems[2] = (uint)uVar6;
            local_f8.data._M_elems[3] = (uint)((ulong)uVar6 >> 0x20);
            local_f8.exp = pnVar4[iVar11].m_backend.exp;
            local_f8.neg = pnVar4[iVar11].m_backend.neg;
            local_f8.fpclass = pnVar4[iVar11].m_backend.fpclass;
            local_f8.prec_elem = pnVar4[iVar11].m_backend.prec_elem;
          }
          bVar10 = boost::multiprecision::operator!=
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_138,
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_f8);
          if (bVar10) {
            pnVar4 = (this->theFvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_178.fpclass = cpp_dec_float_finite;
            local_178.prec_elem = 10;
            local_178.data._M_elems[0] = 0;
            local_178.data._M_elems[1] = 0;
            local_178.data._M_elems[2] = 0;
            local_178.data._M_elems[3] = 0;
            local_178.data._M_elems[4] = 0;
            local_178.data._M_elems[5] = 0;
            local_178.data._M_elems._24_5_ = 0;
            local_178.data._M_elems[7]._1_3_ = 0;
            local_178.data._M_elems[8] = 0;
            local_178.data._M_elems[9] = 0;
            local_178.exp = 0;
            local_178.neg = false;
            local_c0 = uVar17;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_178,&local_138,&local_68);
            tVar9 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems + lVar16
                                  ),(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&local_178);
            if (tVar9) {
              pnVar4 = (this->theUBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(ulong *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x20) =
                   CONCAT44(local_138.data._M_elems[9],local_138.data._M_elems[8]);
              puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x10);
              *puVar1 = CONCAT44(local_138.data._M_elems[5],local_138.data._M_elems[4]);
              puVar1[1] = CONCAT44(local_138.data._M_elems[7],local_138.data._M_elems[6]);
              puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16);
              *puVar1 = CONCAT44(local_138.data._M_elems[1],local_138.data._M_elems[0]);
              puVar1[1] = CONCAT44(local_138.data._M_elems[3],local_138.data._M_elems[2]);
              *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16) = local_138.exp;
              *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 4U) = local_138.neg;
              *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 8U) =
                   local_138._48_8_;
            }
            else {
              tVar9 = boost::multiprecision::operator>
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)((long)(this->theFvec->
                                           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start
                                           [0xffffffffffffffff].m_backend.data._M_elems + lVar16),
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_138);
              if (tVar9) {
                local_178.fpclass = cpp_dec_float_finite;
                local_178.prec_elem = 10;
                local_178.data._M_elems[0] = 0;
                local_178.data._M_elems[1] = 0;
                local_178.data._M_elems[2] = 0;
                local_178.data._M_elems[3] = 0;
                local_178.data._M_elems[4] = 0;
                local_178.data._M_elems[5] = 0;
                local_178.data._M_elems._24_5_ = 0;
                local_178.data._M_elems[7]._1_3_ = 0;
                local_178.data._M_elems[8] = 0;
                local_178.data._M_elems[9] = 0;
                local_178.exp = 0;
                local_178.neg = false;
                boost::multiprecision::default_ops::
                eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                          (&local_178,
                           (cpp_dec_float<50U,_int,_void> *)
                           ((long)(this->theUBbound).val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                  _M_elems + lVar16),&local_138);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (local_140,&local_178);
              }
            }
            pnVar4 = (this->theFvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_178.fpclass = cpp_dec_float_finite;
            local_178.prec_elem = 10;
            local_178.data._M_elems[0] = 0;
            local_178.data._M_elems[1] = 0;
            local_178.data._M_elems[2] = 0;
            local_178.data._M_elems[3] = 0;
            local_178.data._M_elems[4] = 0;
            local_178.data._M_elems[5] = 0;
            local_178.data._M_elems._24_5_ = 0;
            local_178.data._M_elems[7]._1_3_ = 0;
            local_178.data._M_elems[8] = 0;
            local_178.data._M_elems[9] = 0;
            local_178.exp = 0;
            local_178.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_178,&local_f8,&local_68);
            tVar9 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems + lVar16
                                  ),(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&local_178);
            if (tVar9) {
              pnVar4 = (this->theLBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(ulong *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x20) =
                   CONCAT44(local_f8.data._M_elems[9],local_f8.data._M_elems[8]);
              puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x10);
              *puVar1 = CONCAT44(local_f8.data._M_elems[5],local_f8.data._M_elems[4]);
              puVar1[1] = CONCAT44(local_f8.data._M_elems[7],local_f8.data._M_elems[6]);
              puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16);
              *puVar1 = CONCAT44(local_f8.data._M_elems[1],local_f8.data._M_elems[0]);
              puVar1[1] = CONCAT44(local_f8.data._M_elems[3],local_f8.data._M_elems[2]);
              *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16) = local_f8.exp;
              *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 4U) = local_f8.neg;
              *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 8U) =
                   local_f8._48_8_;
              uVar17 = local_c0;
            }
            else {
              tVar9 = boost::multiprecision::operator<
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)((long)(this->theFvec->
                                           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start
                                           [0xffffffffffffffff].m_backend.data._M_elems + lVar16),
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_f8);
              uVar17 = local_c0;
              if (tVar9) {
                local_178.fpclass = cpp_dec_float_finite;
                local_178.prec_elem = 10;
                local_178.data._M_elems[0] = 0;
                local_178.data._M_elems[1] = 0;
                local_178.data._M_elems[2] = 0;
                local_178.data._M_elems[3] = 0;
                local_178.data._M_elems[4] = 0;
                local_178.data._M_elems[5] = 0;
                local_178.data._M_elems._24_5_ = 0;
                local_178.data._M_elems[7]._1_3_ = 0;
                local_178.data._M_elems[8] = 0;
                local_178.data._M_elems[9] = 0;
                local_178.exp = 0;
                local_178.neg = false;
                boost::multiprecision::default_ops::
                eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                          (&local_178,
                           (cpp_dec_float<50U,_int,_void> *)
                           ((long)(this->theLBbound).val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                  _M_elems + lVar16),&local_f8);
                uVar17 = local_c0;
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                          (local_140,&local_178);
              }
            }
          }
          else {
            tVar9 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)(this->theUBbound).val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                         data._M_elems + lVar16),
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_138);
            if (tVar9) {
              local_178.fpclass = cpp_dec_float_finite;
              local_178.prec_elem = 10;
              local_178.data._M_elems[0] = 0;
              local_178.data._M_elems[1] = 0;
              local_178.data._M_elems[2] = 0;
              local_178.data._M_elems[3] = 0;
              local_178.data._M_elems[4] = 0;
              local_178.data._M_elems[5] = 0;
              local_178.data._M_elems._24_5_ = 0;
              local_178.data._M_elems[7]._1_3_ = 0;
              local_178.data._M_elems[8] = 0;
              local_178.data._M_elems[9] = 0;
              local_178.exp = 0;
              local_178.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&local_178,
                         (cpp_dec_float<50U,_int,_void> *)
                         ((long)(this->theUBbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar16),&local_138);
            }
            else {
              tVar9 = boost::multiprecision::operator<
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)((long)(this->theLBbound).val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                           data._M_elems + lVar16),
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_f8);
              if (!tVar9) goto LAB_001ec28e;
              local_178.fpclass = cpp_dec_float_finite;
              local_178.prec_elem = 10;
              local_178.data._M_elems[0] = 0;
              local_178.data._M_elems[1] = 0;
              local_178.data._M_elems[2] = 0;
              local_178.data._M_elems[3] = 0;
              local_178.data._M_elems[4] = 0;
              local_178.data._M_elems[5] = 0;
              local_178.data._M_elems._24_5_ = 0;
              local_178.data._M_elems[7]._1_3_ = 0;
              local_178.data._M_elems[8] = 0;
              local_178.data._M_elems[9] = 0;
              local_178.exp = 0;
              local_178.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&local_178,&local_f8,
                         (cpp_dec_float<50U,_int,_void> *)
                         ((long)(this->theLBbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar16));
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (local_140,&local_178);
          }
LAB_001ec28e:
          uVar17 = uVar17 - 1;
          lVar16 = lVar16 + -0x38;
        }
        uVar17 = (ulong)(uint)(this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum;
        lVar16 = uVar17 * 0x38;
        for (; 0 < (int)uVar17; uVar17 = uVar17 - 1) {
          if (this->theRep *
              (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.rowstat.data[uVar17 - 1] < 1) {
            pnVar4 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .left.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_138.data._M_elems[0] =
                 *(uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16);
            local_138.data._M_elems[9] =
                 *(uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x24);
            puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x14);
            uVar5 = *puVar1;
            uVar6 = puVar1[1];
            puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 4);
            uVar7 = *puVar1;
            uVar8 = puVar1[1];
            local_138._48_8_ = *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 8U)
            ;
            local_138.neg =
                 (bool)((local_138.data._M_elems[0] != 0 ||
                        local_138.fpclass != cpp_dec_float_finite) ^
                       *(byte *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 4U));
            local_138.exp = *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16);
            local_138.data._M_elems[5] = (uint)uVar5;
            local_138.data._M_elems[6] = (uint)((ulong)uVar5 >> 0x20);
            local_138.data._M_elems[7] = (uint)uVar6;
            local_138.data._M_elems[8] = (uint)((ulong)uVar6 >> 0x20);
            local_138.data._M_elems[1] = (uint)uVar7;
            local_138.data._M_elems[2] = (uint)((ulong)uVar7 >> 0x20);
            local_138.data._M_elems[3] = (uint)uVar8;
            local_138.data._M_elems[4] = (uint)((ulong)uVar8 >> 0x20);
            pnVar4 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .right.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_f8.data._M_elems[0] = *(uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16)
            ;
            local_178.data._M_elems[8] =
                 *(uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x24);
            puVar2 = (uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x14);
            local_178.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            uVar5 = *(undefined8 *)(puVar2 + 2);
            local_178.data._M_elems._24_5_ = SUB85(uVar5,0);
            local_178.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
            pauVar3 = (undefined1 (*) [16])((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 4);
            local_178.data._M_elems._0_16_ = *pauVar3;
            local_f8.exp = *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16);
            local_f8._48_8_ = *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 8U);
            local_f8.neg = (bool)((local_f8.data._M_elems[0] != 0 ||
                                  local_f8.fpclass != cpp_dec_float_finite) ^
                                 *(byte *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 4U));
            local_f8.data._M_elems[5] = local_178.data._M_elems[4];
            local_f8.data._M_elems[6] = local_178.data._M_elems[5];
            local_f8.data._M_elems[7] = (uint)uVar5;
            local_f8.data._M_elems[8] = (uint)((ulong)uVar5 >> 0x20);
            local_f8.data._M_elems[1] = (uint)*(undefined8 *)*pauVar3;
            local_f8.data._M_elems[2] = (uint)((ulong)*(undefined8 *)*pauVar3 >> 0x20);
            local_f8.data._M_elems[3] = (uint)*(undefined8 *)(*pauVar3 + 8);
            local_f8.data._M_elems[4] = (uint)((ulong)*(undefined8 *)(*pauVar3 + 8) >> 0x20);
            local_f8.data._M_elems[9] = local_178.data._M_elems[8];
            tVar9 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)(this->theURbound).val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                         data._M_elems + lVar16),
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_138);
            if (tVar9) {
              local_178.fpclass = cpp_dec_float_finite;
              local_178.prec_elem = 10;
              local_178.data._M_elems[0] = 0;
              local_178.data._M_elems[1] = 0;
              local_178.data._M_elems[2] = 0;
              local_178.data._M_elems[3] = 0;
              local_178.data._M_elems[4] = 0;
              local_178.data._M_elems[5] = 0;
              local_178.data._M_elems._24_5_ = 0;
              local_178.data._M_elems[7]._1_3_ = 0;
              local_178.data._M_elems[8] = 0;
              local_178.data._M_elems[9] = 0;
              local_178.exp = 0;
              local_178.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&local_178,
                         (cpp_dec_float<50U,_int,_void> *)
                         ((long)(this->theURbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar16),&local_138);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_140,&local_178);
            }
            tVar9 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_f8,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)(this->theLRbound).val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                         data._M_elems + lVar16));
            if (tVar9) {
              local_178.fpclass = cpp_dec_float_finite;
              local_178.prec_elem = 10;
              local_178.data._M_elems[0] = 0;
              local_178.data._M_elems[1] = 0;
              local_178.data._M_elems[2] = 0;
              local_178.data._M_elems[3] = 0;
              local_178.data._M_elems[4] = 0;
              local_178.data._M_elems[5] = 0;
              local_178.data._M_elems._24_5_ = 0;
              local_178.data._M_elems[7]._1_3_ = 0;
              local_178.data._M_elems[8] = 0;
              local_178.data._M_elems[9] = 0;
              local_178.exp = 0;
              local_178.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&local_178,&local_f8,
                         (cpp_dec_float<50U,_int,_void> *)
                         ((long)(this->theLRbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar16));
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_140,&local_178);
            }
          }
          lVar16 = lVar16 + -0x38;
        }
        uVar17 = (ulong)(uint)(this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum;
        lVar16 = uVar17 * 0x38;
        for (; 0 < (int)uVar17; uVar17 = uVar17 - 1) {
          if (this->theRep *
              (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.colstat.data[uVar17 - 1] < 1) {
            pnVar4 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .up.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar5 = *(undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x20);
            local_138.data._M_elems[8] = (uint)uVar5;
            local_138.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
            puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16);
            uVar5 = *puVar1;
            uVar6 = puVar1[1];
            puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x10);
            uVar7 = *puVar1;
            uVar8 = puVar1[1];
            local_138.data._M_elems[4] = (uint)uVar7;
            local_138.data._M_elems[5] = (uint)((ulong)uVar7 >> 0x20);
            local_138.data._M_elems[6] = (uint)uVar8;
            local_138.data._M_elems[7] = (uint)((ulong)uVar8 >> 0x20);
            local_138.data._M_elems[0] = (uint)uVar5;
            local_138.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
            local_138.data._M_elems[2] = (uint)uVar6;
            local_138.data._M_elems[3] = (uint)((ulong)uVar6 >> 0x20);
            local_138.exp = *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16);
            local_138.neg = *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 4U);
            local_138._48_8_ = *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 8U)
            ;
            pnVar4 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .low.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar5 = *(undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x20);
            local_f8.data._M_elems[8] = (uint)uVar5;
            local_f8.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
            puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16);
            uVar5 = *puVar1;
            uVar6 = puVar1[1];
            puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x10);
            uVar7 = *puVar1;
            uVar8 = puVar1[1];
            local_f8.data._M_elems[4] = (uint)uVar7;
            local_f8.data._M_elems[5] = (uint)((ulong)uVar7 >> 0x20);
            local_f8.data._M_elems[6] = (uint)uVar8;
            local_f8.data._M_elems[7] = (uint)((ulong)uVar8 >> 0x20);
            local_f8.data._M_elems[0] = (uint)uVar5;
            local_f8.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
            local_f8.data._M_elems[2] = (uint)uVar6;
            local_f8.data._M_elems[3] = (uint)((ulong)uVar6 >> 0x20);
            local_f8.exp = *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16);
            local_f8.neg = *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 4U);
            local_f8._48_8_ = *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 8U);
            tVar9 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)(this->theUCbound).val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                         data._M_elems + lVar16),
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_138);
            if (tVar9) {
              local_178.fpclass = cpp_dec_float_finite;
              local_178.prec_elem = 10;
              local_178.data._M_elems[0] = 0;
              local_178.data._M_elems[1] = 0;
              local_178.data._M_elems[2] = 0;
              local_178.data._M_elems[3] = 0;
              local_178.data._M_elems[4] = 0;
              local_178.data._M_elems[5] = 0;
              local_178.data._M_elems._24_5_ = 0;
              local_178.data._M_elems[7]._1_3_ = 0;
              local_178.data._M_elems[8] = 0;
              local_178.data._M_elems[9] = 0;
              local_178.exp = 0;
              local_178.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&local_178,
                         (cpp_dec_float<50U,_int,_void> *)
                         ((long)(this->theUCbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar16),&local_138);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_140,&local_178);
            }
            tVar9 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_f8,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)(this->theLCbound).val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                         data._M_elems + lVar16));
            if (tVar9) {
              local_178.fpclass = cpp_dec_float_finite;
              local_178.prec_elem = 10;
              local_178.data._M_elems[0] = 0;
              local_178.data._M_elems[1] = 0;
              local_178.data._M_elems[2] = 0;
              local_178.data._M_elems[3] = 0;
              local_178.data._M_elems[4] = 0;
              local_178.data._M_elems[5] = 0;
              local_178.data._M_elems._24_5_ = 0;
              local_178.data._M_elems[7]._1_3_ = 0;
              local_178.data._M_elems[8] = 0;
              local_178.data._M_elems[9] = 0;
              local_178.exp = 0;
              local_178.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&local_178,&local_f8,
                         (cpp_dec_float<50U,_int,_void> *)
                         ((long)(this->theLCbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar16));
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_140,&local_178);
            }
          }
          lVar16 = lVar16 + -0x38;
        }
      }
      else {
        local_70 = &(this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.colstat.data;
        local_78 = &(this->
                    super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).thedesc.rowstat.data;
        lVar16 = uVar17 * 0x38;
        while( true ) {
          if ((int)uVar17 < 1) break;
          local_b8.data._M_elems._0_8_ =
               (this->
               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).theBaseId.data[uVar17 - 1].super_DataKey;
          iVar11 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::number(&this->
                             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ,(SPxId *)&local_b8);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&local_f8,0);
          local_138.data._M_elems[0] = local_f8.data._M_elems[0];
          local_138.data._M_elems[1] = local_f8.data._M_elems[1];
          local_138.data._M_elems[2] = local_f8.data._M_elems[2];
          local_138.data._M_elems[3] = local_f8.data._M_elems[3];
          local_138.data._M_elems[4] = local_f8.data._M_elems[4];
          local_138.data._M_elems[5] = local_f8.data._M_elems[5];
          local_138.data._M_elems[6] = local_f8.data._M_elems[6];
          local_138.data._M_elems[7] = local_f8.data._M_elems[7];
          local_138.data._M_elems[8] = local_f8.data._M_elems[8];
          local_138.data._M_elems[9] = local_f8.data._M_elems[9];
          local_138.exp = local_f8.exp;
          local_138.neg = local_f8.neg;
          local_138.fpclass = local_f8.fpclass;
          local_138.prec_elem = local_f8.prec_elem;
          ppSVar13 = local_70;
          if ((int)local_b8.data._M_elems[0] < 0) {
            ppSVar13 = local_78;
          }
          clearDualBounds(this,(*ppSVar13)[iVar11],
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_138,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_f8);
          bVar10 = boost::multiprecision::operator!=
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)((long)(this->theUBbound).val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data
                                        ._M_elems + lVar16),
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)((long)(this->theLBbound).val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data
                                        ._M_elems + lVar16));
          if (bVar10) {
            tVar9 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)(this->theUBbound).val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                         data._M_elems + lVar16),
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_138);
            if (tVar9) {
              local_178.fpclass = cpp_dec_float_finite;
              local_178.prec_elem = 10;
              local_178.data._M_elems[0] = 0;
              local_178.data._M_elems[1] = 0;
              local_178.data._M_elems[2] = 0;
              local_178.data._M_elems[3] = 0;
              local_178.data._M_elems[4] = 0;
              local_178.data._M_elems[5] = 0;
              local_178.data._M_elems._24_5_ = 0;
              local_178.data._M_elems[7]._1_3_ = 0;
              local_178.data._M_elems[8] = 0;
              local_178.data._M_elems[9] = 0;
              local_178.exp = 0;
              local_178.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&local_178,
                         (cpp_dec_float<50U,_int,_void> *)
                         ((long)(this->theUBbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar16),&local_138);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_140,&local_178);
            }
            else {
              local_178.fpclass = cpp_dec_float_finite;
              local_178.prec_elem = 10;
              local_178.data._M_elems[0] = 0;
              local_178.data._M_elems[1] = 0;
              local_178.data._M_elems[2] = 0;
              local_178.data._M_elems[3] = 0;
              local_178.data._M_elems[4] = 0;
              local_178.data._M_elems[5] = 0;
              local_178.data._M_elems._24_5_ = 0;
              local_178.data._M_elems[7]._1_3_ = 0;
              local_178.data._M_elems[8] = 0;
              local_178.data._M_elems[9] = 0;
              local_178.exp = 0;
              local_178.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&local_178,
                         (cpp_dec_float<50U,_int,_void> *)
                         ((long)(this->theUBbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar16),&local_138);
LAB_001ed674:
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                        (local_140,&local_178);
            }
          }
          else {
            pnVar4 = (this->theFvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_178.fpclass = cpp_dec_float_finite;
            local_178.prec_elem = 10;
            local_178.data._M_elems[0] = 0;
            local_178.data._M_elems[1] = 0;
            local_178.data._M_elems[2] = 0;
            local_178.data._M_elems[3] = 0;
            local_178.data._M_elems[4] = 0;
            local_178.data._M_elems[5] = 0;
            local_178.data._M_elems._24_5_ = 0;
            local_178.data._M_elems[7]._1_3_ = 0;
            local_178.data._M_elems[8] = 0;
            local_178.data._M_elems[9] = 0;
            local_178.exp = 0;
            local_178.neg = false;
            local_c0 = uVar17;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_178,&local_138,&local_68);
            tVar9 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems + lVar16
                                  ),(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&local_178);
            if (tVar9) {
              pnVar4 = (this->theUBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(ulong *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x20) =
                   CONCAT44(local_138.data._M_elems[9],local_138.data._M_elems[8]);
              puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x10);
              *puVar1 = CONCAT44(local_138.data._M_elems[5],local_138.data._M_elems[4]);
              puVar1[1] = CONCAT44(local_138.data._M_elems[7],local_138.data._M_elems[6]);
              puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16);
              *puVar1 = CONCAT44(local_138.data._M_elems[1],local_138.data._M_elems[0]);
              puVar1[1] = CONCAT44(local_138.data._M_elems[3],local_138.data._M_elems[2]);
              *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16) = local_138.exp;
              *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 4U) = local_138.neg;
              *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 8U) =
                   local_138._48_8_;
            }
            else {
              tVar9 = boost::multiprecision::operator>
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)((long)(this->theFvec->
                                           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start
                                           [0xffffffffffffffff].m_backend.data._M_elems + lVar16),
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_138);
              if (tVar9) {
                local_178.fpclass = cpp_dec_float_finite;
                local_178.prec_elem = 10;
                local_178.data._M_elems[0] = 0;
                local_178.data._M_elems[1] = 0;
                local_178.data._M_elems[2] = 0;
                local_178.data._M_elems[3] = 0;
                local_178.data._M_elems[4] = 0;
                local_178.data._M_elems[5] = 0;
                local_178.data._M_elems._24_5_ = 0;
                local_178.data._M_elems[7]._1_3_ = 0;
                local_178.data._M_elems[8] = 0;
                local_178.data._M_elems[9] = 0;
                local_178.exp = 0;
                local_178.neg = false;
                boost::multiprecision::default_ops::
                eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                          (&local_178,
                           (cpp_dec_float<50U,_int,_void> *)
                           ((long)(this->theUBbound).val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                  _M_elems + lVar16),&local_138);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (local_140,&local_178);
              }
            }
            pnVar4 = (this->theFvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_178.fpclass = cpp_dec_float_finite;
            local_178.prec_elem = 10;
            local_178.data._M_elems[0] = 0;
            local_178.data._M_elems[1] = 0;
            local_178.data._M_elems[2] = 0;
            local_178.data._M_elems[3] = 0;
            local_178.data._M_elems[4] = 0;
            local_178.data._M_elems[5] = 0;
            local_178.data._M_elems._24_5_ = 0;
            local_178.data._M_elems[7]._1_3_ = 0;
            local_178.data._M_elems[8] = 0;
            local_178.data._M_elems[9] = 0;
            local_178.exp = 0;
            local_178.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_178,&local_f8,&local_68);
            tVar9 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems + lVar16
                                  ),(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&local_178);
            if (tVar9) {
              pnVar4 = (this->theLBbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(ulong *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x20) =
                   CONCAT44(local_f8.data._M_elems[9],local_f8.data._M_elems[8]);
              puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x10);
              *puVar1 = CONCAT44(local_f8.data._M_elems[5],local_f8.data._M_elems[4]);
              puVar1[1] = CONCAT44(local_f8.data._M_elems[7],local_f8.data._M_elems[6]);
              puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16);
              *puVar1 = CONCAT44(local_f8.data._M_elems[1],local_f8.data._M_elems[0]);
              puVar1[1] = CONCAT44(local_f8.data._M_elems[3],local_f8.data._M_elems[2]);
              *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16) = local_f8.exp;
              *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 4U) = local_f8.neg;
              *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 8U) =
                   local_f8._48_8_;
              uVar17 = local_c0;
            }
            else {
              tVar9 = boost::multiprecision::operator<
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)((long)(this->theFvec->
                                           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                           ).val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start
                                           [0xffffffffffffffff].m_backend.data._M_elems + lVar16),
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_f8);
              uVar17 = local_c0;
              if (tVar9) {
                local_178.fpclass = cpp_dec_float_finite;
                local_178.prec_elem = 10;
                local_178.data._M_elems[0] = 0;
                local_178.data._M_elems[1] = 0;
                local_178.data._M_elems[2] = 0;
                local_178.data._M_elems[3] = 0;
                local_178.data._M_elems[4] = 0;
                local_178.data._M_elems[5] = 0;
                local_178.data._M_elems._24_5_ = 0;
                local_178.data._M_elems[7]._1_3_ = 0;
                local_178.data._M_elems[8] = 0;
                local_178.data._M_elems[9] = 0;
                local_178.exp = 0;
                local_178.neg = false;
                boost::multiprecision::default_ops::
                eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                          (&local_178,
                           (cpp_dec_float<50U,_int,_void> *)
                           ((long)(this->theLBbound).val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                  _M_elems + lVar16),&local_f8);
                uVar17 = local_c0;
                goto LAB_001ed674;
              }
            }
          }
          uVar17 = uVar17 - 1;
          lVar16 = lVar16 + -0x38;
        }
        uVar17 = (ulong)(uint)(this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum;
        lVar16 = uVar17 * 0x38;
        for (; 0 < (int)uVar17; uVar17 = uVar17 - 1) {
          if (this->theRep *
              (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.rowstat.data[uVar17 - 1] < 1) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&local_f8,0);
            local_138.data._M_elems[0] = local_f8.data._M_elems[0];
            local_138.data._M_elems[1] = local_f8.data._M_elems[1];
            local_138.data._M_elems[2] = local_f8.data._M_elems[2];
            local_138.data._M_elems[3] = local_f8.data._M_elems[3];
            local_138.data._M_elems[4] = local_f8.data._M_elems[4];
            local_138.data._M_elems[5] = local_f8.data._M_elems[5];
            local_138.data._M_elems[6] = local_f8.data._M_elems[6];
            local_138.data._M_elems[7] = local_f8.data._M_elems[7];
            local_138.data._M_elems[8] = local_f8.data._M_elems[8];
            local_138.data._M_elems[9] = local_f8.data._M_elems[9];
            local_138.exp = local_f8.exp;
            local_138.neg = local_f8.neg;
            local_138.fpclass = local_f8.fpclass;
            local_138.prec_elem = local_f8.prec_elem;
            clearDualBounds(this,(this->
                                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).thedesc.rowstat.data[uVar17 - 1],
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_138,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_f8);
            tVar9 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)(this->theURbound).val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                         data._M_elems + lVar16),
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_138);
            if (tVar9) {
              local_178.fpclass = cpp_dec_float_finite;
              local_178.prec_elem = 10;
              local_178.data._M_elems[0] = 0;
              local_178.data._M_elems[1] = 0;
              local_178.data._M_elems[2] = 0;
              local_178.data._M_elems[3] = 0;
              local_178.data._M_elems[4] = 0;
              local_178.data._M_elems[5] = 0;
              local_178.data._M_elems._24_5_ = 0;
              local_178.data._M_elems[7]._1_3_ = 0;
              local_178.data._M_elems[8] = 0;
              local_178.data._M_elems[9] = 0;
              local_178.exp = 0;
              local_178.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&local_178,
                         (cpp_dec_float<50U,_int,_void> *)
                         ((long)(this->theURbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar16),&local_138);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_140,&local_178);
            }
            tVar9 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_f8,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)(this->theLRbound).val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                         data._M_elems + lVar16));
            if (tVar9) {
              local_178.fpclass = cpp_dec_float_finite;
              local_178.prec_elem = 10;
              local_178.data._M_elems[0] = 0;
              local_178.data._M_elems[1] = 0;
              local_178.data._M_elems[2] = 0;
              local_178.data._M_elems[3] = 0;
              local_178.data._M_elems[4] = 0;
              local_178.data._M_elems[5] = 0;
              local_178.data._M_elems._24_5_ = 0;
              local_178.data._M_elems[7]._1_3_ = 0;
              local_178.data._M_elems[8] = 0;
              local_178.data._M_elems[9] = 0;
              local_178.exp = 0;
              local_178.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&local_178,&local_f8,
                         (cpp_dec_float<50U,_int,_void> *)
                         ((long)(this->theLRbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar16));
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_140,&local_178);
            }
          }
          lVar16 = lVar16 + -0x38;
        }
        uVar17 = (ulong)(uint)(this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum;
        lVar16 = uVar17 * 0x38;
        for (; 0 < (int)uVar17; uVar17 = uVar17 - 1) {
          if (this->theRep *
              (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.colstat.data[uVar17 - 1] < 1) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&local_f8,0);
            local_138.data._M_elems[0] = local_f8.data._M_elems[0];
            local_138.data._M_elems[1] = local_f8.data._M_elems[1];
            local_138.data._M_elems[2] = local_f8.data._M_elems[2];
            local_138.data._M_elems[3] = local_f8.data._M_elems[3];
            local_138.data._M_elems[4] = local_f8.data._M_elems[4];
            local_138.data._M_elems[5] = local_f8.data._M_elems[5];
            local_138.data._M_elems[6] = local_f8.data._M_elems[6];
            local_138.data._M_elems[7] = local_f8.data._M_elems[7];
            local_138.data._M_elems[8] = local_f8.data._M_elems[8];
            local_138.data._M_elems[9] = local_f8.data._M_elems[9];
            local_138.exp = local_f8.exp;
            local_138.neg = local_f8.neg;
            local_138.fpclass = local_f8.fpclass;
            local_138.prec_elem = local_f8.prec_elem;
            clearDualBounds(this,(this->
                                 super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).thedesc.colstat.data[uVar17 - 1],
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_138,
                            (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_f8);
            tVar9 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)(this->theUCbound).val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                         data._M_elems + lVar16),
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_138);
            if (tVar9) {
              local_178.fpclass = cpp_dec_float_finite;
              local_178.prec_elem = 10;
              local_178.data._M_elems[0] = 0;
              local_178.data._M_elems[1] = 0;
              local_178.data._M_elems[2] = 0;
              local_178.data._M_elems[3] = 0;
              local_178.data._M_elems[4] = 0;
              local_178.data._M_elems[5] = 0;
              local_178.data._M_elems._24_5_ = 0;
              local_178.data._M_elems[7]._1_3_ = 0;
              local_178.data._M_elems[8] = 0;
              local_178.data._M_elems[9] = 0;
              local_178.exp = 0;
              local_178.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&local_178,
                         (cpp_dec_float<50U,_int,_void> *)
                         ((long)(this->theUCbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar16),&local_138);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_140,&local_178);
            }
            tVar9 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_f8,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)(this->theLCbound).val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                         data._M_elems + lVar16));
            if (tVar9) {
              local_178.fpclass = cpp_dec_float_finite;
              local_178.prec_elem = 10;
              local_178.data._M_elems[0] = 0;
              local_178.data._M_elems[1] = 0;
              local_178.data._M_elems[2] = 0;
              local_178.data._M_elems[3] = 0;
              local_178.data._M_elems[4] = 0;
              local_178.data._M_elems[5] = 0;
              local_178.data._M_elems._24_5_ = 0;
              local_178.data._M_elems[7]._1_3_ = 0;
              local_178.data._M_elems[8] = 0;
              local_178.data._M_elems[9] = 0;
              local_178.exp = 0;
              local_178.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&local_178,&local_f8,
                         (cpp_dec_float<50U,_int,_void> *)
                         ((long)(this->theLCbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar16));
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_140,&local_178);
            }
          }
          lVar16 = lVar16 + -0x38;
        }
      }
    }
    else {
      leavetol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_68,this);
      uVar17 = (ulong)(uint)(this->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .
                            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            .set.thenum;
      if (this->theRep == COLUMN) {
        lVar16 = uVar17 * 0x38;
        while( true ) {
          pcVar15 = &local_f8;
          pcVar14 = &local_138;
          if ((int)uVar17 < 1) break;
          pnVar4 = (this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .object.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar5 = *(undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x20);
          local_f8.data._M_elems[8] = (uint)uVar5;
          local_f8.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
          puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16);
          uVar5 = *puVar1;
          uVar6 = puVar1[1];
          puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x10);
          uVar7 = *puVar1;
          uVar8 = puVar1[1];
          local_f8.data._M_elems[4] = (uint)uVar7;
          local_f8.data._M_elems[5] = (uint)((ulong)uVar7 >> 0x20);
          local_f8.data._M_elems[6] = (uint)uVar8;
          local_f8.data._M_elems[7] = (uint)((ulong)uVar8 >> 0x20);
          local_f8.data._M_elems[0] = (uint)uVar5;
          local_f8.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
          local_f8.data._M_elems[2] = (uint)uVar6;
          local_f8.data._M_elems[3] = (uint)((ulong)uVar6 >> 0x20);
          local_138.exp = *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16);
          local_138.neg = *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 4U);
          local_f8.fpclass = *(fpclass_type *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 8U)
          ;
          local_f8.prec_elem = *(int32_t *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 0xcU);
          local_138.prec_elem = local_f8.prec_elem;
          local_138.fpclass = local_f8.fpclass;
          local_138.data._M_elems[0] = local_f8.data._M_elems[0];
          local_138.data._M_elems[1] = local_f8.data._M_elems[1];
          local_138.data._M_elems[2] = local_f8.data._M_elems[2];
          local_138.data._M_elems[3] = local_f8.data._M_elems[3];
          local_138.data._M_elems[4] = local_f8.data._M_elems[4];
          local_138.data._M_elems[5] = local_f8.data._M_elems[5];
          local_138.data._M_elems[6] = local_f8.data._M_elems[6];
          local_138.data._M_elems[7] = local_f8.data._M_elems[7];
          local_138.data._M_elems[8] = local_f8.data._M_elems[8];
          local_138.data._M_elems[9] = local_f8.data._M_elems[9];
          local_f8.exp = local_138.exp;
          local_f8.neg = local_138.neg;
          clearDualBounds(this,(this->
                               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).thedesc.rowstat.data[uVar17 - 1],
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)pcVar14,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)pcVar15);
          if (this->theRep *
              (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.rowstat.data[uVar17 - 1] < 1) {
            pnVar4 = (this->theCoPvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_178.fpclass = cpp_dec_float_finite;
            local_178.prec_elem = 10;
            local_178.data._M_elems[0] = 0;
            local_178.data._M_elems[1] = 0;
            local_178.data._M_elems[2] = 0;
            local_178.data._M_elems[3] = 0;
            local_178.data._M_elems[4] = 0;
            local_178.data._M_elems[5] = 0;
            local_178.data._M_elems._24_5_ = 0;
            local_178.data._M_elems[7]._1_3_ = 0;
            local_178.data._M_elems[8] = 0;
            local_178.data._M_elems[9] = 0;
            local_178.exp = 0;
            local_178.neg = false;
            local_c0 = uVar17;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_178,pcVar14,&local_68);
            tVar9 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems + lVar16
                                  ),(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&local_178);
            if (tVar9) {
              pnVar4 = (this->theURbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(ulong *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x20) =
                   CONCAT44(local_138.data._M_elems[9],local_138.data._M_elems[8]);
              puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x10);
              *puVar1 = CONCAT44(local_138.data._M_elems[5],local_138.data._M_elems[4]);
              puVar1[1] = CONCAT44(local_138.data._M_elems[7],local_138.data._M_elems[6]);
              puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16);
              *puVar1 = CONCAT44(local_138.data._M_elems[1],local_138.data._M_elems[0]);
              puVar1[1] = CONCAT44(local_138.data._M_elems[3],local_138.data._M_elems[2]);
              *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16) = local_138.exp;
              *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 4U) = local_138.neg;
              *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 8U) =
                   local_138._48_8_;
              bVar10 = boost::multiprecision::operator==
                                 ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)pcVar14,
                                  (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_f8);
              if (bVar10) {
                pnVar4 = (this->theLRbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                *(ulong *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x20) =
                     CONCAT44(local_f8.data._M_elems[9],local_f8.data._M_elems[8]);
                puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x10);
                *puVar1 = CONCAT44(local_f8.data._M_elems[5],local_f8.data._M_elems[4]);
                puVar1[1] = CONCAT44(local_f8.data._M_elems[7],local_f8.data._M_elems[6]);
                puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16);
                *puVar1 = CONCAT44(local_f8.data._M_elems[1],local_f8.data._M_elems[0]);
                puVar1[1] = CONCAT44(local_f8.data._M_elems[3],local_f8.data._M_elems[2]);
                *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16) = local_f8.exp;
                *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 4U) = local_f8.neg;
                *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 8U) =
                     local_f8._48_8_;
              }
            }
            else {
              local_178.fpclass = cpp_dec_float_finite;
              local_178.prec_elem = 10;
              local_178.data._M_elems[0] = 0;
              local_178.data._M_elems[1] = 0;
              local_178.data._M_elems[2] = 0;
              local_178.data._M_elems[3] = 0;
              local_178.data._M_elems[4] = 0;
              local_178.data._M_elems[5] = 0;
              local_178.data._M_elems._24_5_ = 0;
              local_178.data._M_elems[7]._1_3_ = 0;
              local_178.data._M_elems[8] = 0;
              local_178.data._M_elems[9] = 0;
              local_178.exp = 0;
              local_178.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&local_178,
                         (cpp_dec_float<50U,_int,_void> *)
                         ((long)(this->theURbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar16),pcVar14);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_140,&local_178);
            }
            pnVar4 = (this->theCoPvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_178.fpclass = cpp_dec_float_finite;
            local_178.prec_elem = 10;
            local_178.data._M_elems[0] = 0;
            local_178.data._M_elems[1] = 0;
            local_178.data._M_elems[2] = 0;
            local_178.data._M_elems[3] = 0;
            local_178.data._M_elems[4] = 0;
            local_178.data._M_elems[5] = 0;
            local_178.data._M_elems._24_5_ = 0;
            local_178.data._M_elems[7]._1_3_ = 0;
            local_178.data._M_elems[8] = 0;
            local_178.data._M_elems[9] = 0;
            local_178.exp = 0;
            local_178.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_178,&local_f8,&local_68);
            tVar9 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems + lVar16
                                  ),(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&local_178);
            uVar17 = local_c0;
            if (tVar9) {
              pnVar4 = (this->theLRbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(ulong *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x20) =
                   CONCAT44(local_f8.data._M_elems[9],local_f8.data._M_elems[8]);
              puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x10);
              *puVar1 = CONCAT44(local_f8.data._M_elems[5],local_f8.data._M_elems[4]);
              puVar1[1] = CONCAT44(local_f8.data._M_elems[7],local_f8.data._M_elems[6]);
              puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16);
              *puVar1 = CONCAT44(local_f8.data._M_elems[1],local_f8.data._M_elems[0]);
              puVar1[1] = CONCAT44(local_f8.data._M_elems[3],local_f8.data._M_elems[2]);
              *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16) = local_f8.exp;
              *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 4U) = local_f8.neg;
              *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 8U) =
                   local_f8._48_8_;
              bVar10 = boost::multiprecision::operator==
                                 ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_138,
                                  (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_f8);
              if (bVar10) {
                pnVar4 = (this->theURbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                *(ulong *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x20) =
                     CONCAT44(local_138.data._M_elems[9],local_138.data._M_elems[8]);
                puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x10);
                *puVar1 = CONCAT44(local_138.data._M_elems[5],local_138.data._M_elems[4]);
                puVar1[1] = CONCAT44(local_138.data._M_elems[7],local_138.data._M_elems[6]);
                puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16);
                *puVar1 = CONCAT44(local_138.data._M_elems[1],local_138.data._M_elems[0]);
                puVar1[1] = CONCAT44(local_138.data._M_elems[3],local_138.data._M_elems[2]);
                *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16) = local_138.exp;
                *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 4U) = local_138.neg;
                *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 8U) =
                     local_138._48_8_;
              }
            }
            else {
              local_178.fpclass = cpp_dec_float_finite;
              local_178.prec_elem = 10;
              local_178.data._M_elems[0] = 0;
              local_178.data._M_elems[1] = 0;
              local_178.data._M_elems[2] = 0;
              local_178.data._M_elems[3] = 0;
              local_178.data._M_elems[4] = 0;
              local_178.data._M_elems[5] = 0;
              local_178.data._M_elems._24_5_ = 0;
              local_178.data._M_elems[7]._1_3_ = 0;
              local_178.data._M_elems[8] = 0;
              local_178.data._M_elems[9] = 0;
              local_178.exp = 0;
              local_178.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&local_178,&local_f8,
                         (cpp_dec_float<50U,_int,_void> *)
                         ((long)(this->theLRbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar16));
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_140,&local_178);
            }
          }
          else {
            tVar9 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)(this->theURbound).val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                         data._M_elems + lVar16),
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)pcVar14);
            if (tVar9) {
              pcVar15 = (cpp_dec_float<50U,_int,_void> *)
                        ((long)(this->theURbound).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                        + lVar16);
            }
            else {
              tVar9 = boost::multiprecision::operator<
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)((long)(this->theLRbound).val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                           data._M_elems + lVar16),
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)pcVar15);
              if (!tVar9) goto LAB_001ebd51;
              pcVar14 = (cpp_dec_float<50U,_int,_void> *)
                        ((long)(this->theLRbound).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                        + lVar16);
            }
            local_178.fpclass = cpp_dec_float_finite;
            local_178.prec_elem = 10;
            local_178.neg = false;
            local_178.exp = 0;
            local_178.data._M_elems[9] = 0;
            local_178.data._M_elems[8] = 0;
            local_178.data._M_elems[7]._1_3_ = 0;
            local_178.data._M_elems._24_5_ = 0;
            local_178.data._M_elems[4] = 0;
            local_178.data._M_elems[5] = 0;
            local_178.data._M_elems[0] = 0;
            local_178.data._M_elems[1] = 0;
            local_178.data._M_elems[2] = 0;
            local_178.data._M_elems[3] = 0;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_178,pcVar15,pcVar14);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (local_140,&local_178);
          }
LAB_001ebd51:
          uVar17 = uVar17 - 1;
          lVar16 = lVar16 + -0x38;
        }
        uVar17 = (ulong)(uint)(this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum;
        lVar16 = uVar17 * 0x38;
        for (; 0 < (int)uVar17; uVar17 = uVar17 - 1) {
          pnVar4 = (this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .object.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_138.data._M_elems[0] = *(uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16);
          local_178.data._M_elems[8] =
               *(uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x24);
          puVar2 = (uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x14);
          local_178.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          uVar5 = *(undefined8 *)(puVar2 + 2);
          local_178.data._M_elems._24_5_ = SUB85(uVar5,0);
          local_178.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
          pauVar3 = (undefined1 (*) [16])((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 4);
          local_178.data._M_elems._0_16_ = *pauVar3;
          local_138.exp = *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16);
          local_f8.fpclass = *(fpclass_type *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 8U)
          ;
          local_f8.prec_elem = *(int32_t *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 0xcU);
          local_138.neg =
               (bool)((local_138.data._M_elems[0] != 0 || local_f8.fpclass != cpp_dec_float_finite)
                     ^ *(byte *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 4U));
          local_f8.data._M_elems[5] = local_178.data._M_elems[4];
          local_f8.data._M_elems[6] = local_178.data._M_elems[5];
          local_f8.data._M_elems[7] = (uint)uVar5;
          local_f8.data._M_elems[8] = (uint)((ulong)uVar5 >> 0x20);
          local_f8.data._M_elems[1] = (uint)*(undefined8 *)*pauVar3;
          local_f8.data._M_elems[2] = (uint)((ulong)*(undefined8 *)*pauVar3 >> 0x20);
          local_f8.data._M_elems[3] = (uint)*(undefined8 *)(*pauVar3 + 8);
          local_f8.data._M_elems[4] = (uint)((ulong)*(undefined8 *)(*pauVar3 + 8) >> 0x20);
          local_138.data._M_elems[3] = local_f8.data._M_elems[3];
          local_138.data._M_elems[4] = local_f8.data._M_elems[4];
          local_138.data._M_elems[5] = local_f8.data._M_elems[5];
          local_138.data._M_elems[6] = local_f8.data._M_elems[6];
          local_138.data._M_elems[7] = local_f8.data._M_elems[7];
          local_138.data._M_elems[8] = local_f8.data._M_elems[8];
          local_138.prec_elem = local_f8.prec_elem;
          local_138.fpclass = local_f8.fpclass;
          local_138.data._M_elems[1] = local_f8.data._M_elems[1];
          local_138.data._M_elems[2] = local_f8.data._M_elems[2];
          local_138.data._M_elems[9] = local_178.data._M_elems[8];
          local_f8.data._M_elems[0] = local_138.data._M_elems[0];
          local_f8.data._M_elems[9] = local_178.data._M_elems[8];
          local_f8.exp = local_138.exp;
          local_f8.neg = local_138.neg;
          clearDualBounds(this,(this->
                               super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).thedesc.colstat.data[uVar17 - 1],
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_f8,
                          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)&local_138);
          if (this->theRep *
              (this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).thedesc.colstat.data[uVar17 - 1] < 1) {
            pnVar4 = (this->thePvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_b8.data._M_elems[1] = local_138.data._M_elems[1];
            local_b8.data._M_elems[0] = local_138.data._M_elems[0];
            local_b8.data._M_elems[3] = local_138.data._M_elems[3];
            local_b8.data._M_elems[2] = local_138.data._M_elems[2];
            local_b8.data._M_elems[5] = local_138.data._M_elems[5];
            local_b8.data._M_elems[4] = local_138.data._M_elems[4];
            local_b8.data._M_elems[7] = local_138.data._M_elems[7];
            local_b8.data._M_elems[6] = local_138.data._M_elems[6];
            local_b8.data._M_elems[9] = local_138.data._M_elems[9];
            local_b8.data._M_elems[8] = local_138.data._M_elems[8];
            local_b8.exp = local_138.exp;
            local_b8.neg = local_138.neg;
            local_b8.fpclass = local_138.fpclass;
            local_b8.prec_elem = local_138.prec_elem;
            if (local_138.fpclass != cpp_dec_float_finite || local_138.data._M_elems[0] != 0) {
              local_b8.neg = (bool)(local_138.neg ^ 1);
            }
            local_178.fpclass = cpp_dec_float_finite;
            local_178.prec_elem = 10;
            local_178.data._M_elems._0_16_ = ZEXT816(0);
            local_178.data._M_elems[4] = 0;
            local_178.data._M_elems[5] = 0;
            local_178.data._M_elems._24_5_ = 0;
            local_178.data._M_elems[7]._1_3_ = 0;
            local_178.data._M_elems[8] = 0;
            local_178.data._M_elems[9] = 0;
            local_178.exp = 0;
            local_178.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_178,&local_b8,&local_68);
            tVar9 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems + lVar16
                                  ),(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&local_178);
            if (tVar9) {
              local_178.data._M_elems[1] = local_138.data._M_elems[2];
              local_178.data._M_elems[0] = local_138.data._M_elems[1];
              local_178.data._M_elems[3] = local_138.data._M_elems[4];
              local_178.data._M_elems[2] = local_138.data._M_elems[3];
              local_178.data._M_elems[5] = local_138.data._M_elems[6];
              local_178.data._M_elems[4] = local_138.data._M_elems[5];
              local_178.data._M_elems._24_5_ =
                   SUB85(CONCAT44(local_138.data._M_elems[8],local_138.data._M_elems[7]),0);
              local_178.data._M_elems[7]._1_3_ = (undefined3)(local_138.data._M_elems[8] >> 8);
              local_178.data._M_elems[8] = local_138.data._M_elems[9];
              pnVar4 = (this->theUCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16) =
                   local_138.data._M_elems[0];
              puVar2 = (uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 4);
              *(undefined8 *)puVar2 = local_178.data._M_elems._0_8_;
              *(undefined8 *)(puVar2 + 2) = local_178.data._M_elems._8_8_;
              puVar2 = (uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x14);
              *(undefined8 *)puVar2 = local_178.data._M_elems._16_8_;
              *(ulong *)(puVar2 + 2) =
                   CONCAT35(local_178.data._M_elems[7]._1_3_,local_178.data._M_elems._24_5_);
              *(uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x24) =
                   local_138.data._M_elems[9];
              *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16) = local_138.exp;
              *(char *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 4U) =
                   (local_138.data._M_elems[0] != 0 || local_138.fpclass != cpp_dec_float_finite) ^
                   local_138.neg;
              *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 8U) =
                   local_138._48_8_;
              bVar10 = boost::multiprecision::operator==
                                 ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_138,
                                  (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_f8);
              if (bVar10) {
                local_178.data._M_elems._24_5_ =
                     SUB85(CONCAT44(local_f8.data._M_elems[8],local_f8.data._M_elems[7]),0);
                local_178.data._M_elems[7]._1_3_ = (undefined3)(local_f8.data._M_elems[8] >> 8);
                pnVar4 = (this->theLCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                *(uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16) =
                     local_f8.data._M_elems[0];
                puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 4);
                *puVar1 = CONCAT44(local_f8.data._M_elems[2],local_f8.data._M_elems[1]);
                puVar1[1] = CONCAT44(local_f8.data._M_elems[4],local_f8.data._M_elems[3]);
                puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x14);
                *puVar1 = CONCAT44(local_f8.data._M_elems[6],local_f8.data._M_elems[5]);
                puVar1[1] = CONCAT35(local_178.data._M_elems[7]._1_3_,local_178.data._M_elems._24_5_
                                    );
                *(uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x24) =
                     local_f8.data._M_elems[9];
                *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16) = local_f8.exp;
                *(char *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 4U) =
                     (local_f8.data._M_elems[0] != 0 || local_f8.fpclass != cpp_dec_float_finite) ^
                     local_f8.neg;
                *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 8U) =
                     local_f8._48_8_;
              }
            }
            else {
              local_b8.data._M_elems[1] = local_138.data._M_elems[1];
              local_b8.data._M_elems[0] = local_138.data._M_elems[0];
              local_b8.data._M_elems[3] = local_138.data._M_elems[3];
              local_b8.data._M_elems[2] = local_138.data._M_elems[2];
              local_b8.data._M_elems[5] = local_138.data._M_elems[5];
              local_b8.data._M_elems[4] = local_138.data._M_elems[4];
              local_b8.data._M_elems[7] = local_138.data._M_elems[7];
              local_b8.data._M_elems[6] = local_138.data._M_elems[6];
              local_b8.data._M_elems[9] = local_138.data._M_elems[9];
              local_b8.data._M_elems[8] = local_138.data._M_elems[8];
              local_b8.exp = local_138.exp;
              local_b8.neg = local_138.neg;
              local_b8.fpclass = local_138.fpclass;
              local_b8.prec_elem = local_138.prec_elem;
              if (local_138.fpclass != cpp_dec_float_finite || local_138.data._M_elems[0] != 0) {
                local_b8.neg = (bool)(local_138.neg ^ 1);
              }
              local_178.fpclass = cpp_dec_float_finite;
              local_178.prec_elem = 10;
              local_178.data._M_elems[0] = 0;
              local_178.data._M_elems[1] = 0;
              local_178.data._M_elems[2] = 0;
              local_178.data._M_elems[3] = 0;
              local_178.data._M_elems[4] = 0;
              local_178.data._M_elems[5] = 0;
              local_178.data._M_elems._24_5_ = 0;
              local_178.data._M_elems[7]._1_3_ = 0;
              local_178.data._M_elems[8] = 0;
              local_178.data._M_elems[9] = 0;
              local_178.exp = 0;
              local_178.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&local_178,
                         (cpp_dec_float<50U,_int,_void> *)
                         ((long)(this->theUCbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar16),&local_b8);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_140,&local_178);
            }
            pnVar4 = (this->thePvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_b8.data._M_elems[1] = local_f8.data._M_elems[1];
            local_b8.data._M_elems[0] = local_f8.data._M_elems[0];
            local_b8.data._M_elems[3] = local_f8.data._M_elems[3];
            local_b8.data._M_elems[2] = local_f8.data._M_elems[2];
            local_b8.data._M_elems[5] = local_f8.data._M_elems[5];
            local_b8.data._M_elems[4] = local_f8.data._M_elems[4];
            local_b8.data._M_elems[7] = local_f8.data._M_elems[7];
            local_b8.data._M_elems[6] = local_f8.data._M_elems[6];
            local_b8.data._M_elems[9] = local_f8.data._M_elems[9];
            local_b8.data._M_elems[8] = local_f8.data._M_elems[8];
            local_b8.exp = local_f8.exp;
            local_b8.neg = local_f8.neg;
            local_b8.fpclass = local_f8.fpclass;
            local_b8.prec_elem = local_f8.prec_elem;
            if (local_f8.fpclass != cpp_dec_float_finite || local_f8.data._M_elems[0] != 0) {
              local_b8.neg = (bool)(local_f8.neg ^ 1);
            }
            local_178.fpclass = cpp_dec_float_finite;
            local_178.prec_elem = 10;
            local_178.data._M_elems._0_16_ = ZEXT816(0);
            local_178.data._M_elems[4] = 0;
            local_178.data._M_elems[5] = 0;
            local_178.data._M_elems._24_5_ = 0;
            local_178.data._M_elems[7]._1_3_ = 0;
            local_178.data._M_elems[8] = 0;
            local_178.data._M_elems[9] = 0;
            local_178.exp = 0;
            local_178.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_178,&local_b8,&local_68);
            tVar9 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems + lVar16
                                  ),(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&local_178);
            if (tVar9) {
              local_178.data._M_elems[5] = local_f8.data._M_elems[6];
              local_178.data._M_elems[4] = local_f8.data._M_elems[5];
              local_178.data._M_elems._8_8_ =
                   CONCAT44(local_f8.data._M_elems[4],local_f8.data._M_elems[3]);
              local_178.data._M_elems._0_8_ =
                   CONCAT44(local_f8.data._M_elems[2],local_f8.data._M_elems[1]);
              local_178.data._M_elems._24_5_ =
                   SUB85(CONCAT44(local_f8.data._M_elems[8],local_f8.data._M_elems[7]),0);
              local_178.data._M_elems[7]._1_3_ = (undefined3)(local_f8.data._M_elems[8] >> 8);
              local_178.data._M_elems[8] = local_f8.data._M_elems[9];
              pnVar4 = (this->theLCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16) =
                   local_f8.data._M_elems[0];
              puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 4);
              *puVar1 = CONCAT44(local_f8.data._M_elems[2],local_f8.data._M_elems[1]);
              puVar1[1] = CONCAT44(local_f8.data._M_elems[4],local_f8.data._M_elems[3]);
              puVar2 = (uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x14);
              *(undefined8 *)puVar2 = local_178.data._M_elems._16_8_;
              *(ulong *)(puVar2 + 2) =
                   CONCAT35(local_178.data._M_elems[7]._1_3_,local_178.data._M_elems._24_5_);
              *(uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x24) =
                   local_f8.data._M_elems[9];
              *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16) = local_f8.exp;
              *(char *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 4U) =
                   (local_f8.data._M_elems[0] != 0 || local_f8.fpclass != cpp_dec_float_finite) ^
                   local_f8.neg;
              *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 8U) =
                   local_f8._48_8_;
              bVar10 = boost::multiprecision::operator==
                                 ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_138,
                                  (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                   *)&local_f8);
              if (bVar10) {
                local_178.data._M_elems._24_5_ =
                     SUB85(CONCAT44(local_138.data._M_elems[8],local_138.data._M_elems[7]),0);
                local_178.data._M_elems[7]._1_3_ = (undefined3)(local_138.data._M_elems[8] >> 8);
                pnVar4 = (this->theUCbound).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                *(uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16) =
                     local_138.data._M_elems[0];
                puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 4);
                *puVar1 = CONCAT44(local_138.data._M_elems[2],local_138.data._M_elems[1]);
                puVar1[1] = CONCAT44(local_138.data._M_elems[4],local_138.data._M_elems[3]);
                puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x14);
                *puVar1 = CONCAT44(local_138.data._M_elems[6],local_138.data._M_elems[5]);
                puVar1[1] = CONCAT35(local_178.data._M_elems[7]._1_3_,local_178.data._M_elems._24_5_
                                    );
                *(uint *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x24) =
                     local_138.data._M_elems[9];
                *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16) = local_138.exp;
                *(char *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 4U) =
                     (local_138.data._M_elems[0] != 0 || local_138.fpclass != cpp_dec_float_finite)
                     ^ local_138.neg;
                *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 8U) =
                     local_138._48_8_;
              }
            }
            else {
              local_b8.data._M_elems[1] = local_f8.data._M_elems[1];
              local_b8.data._M_elems[0] = local_f8.data._M_elems[0];
              local_b8.data._M_elems[3] = local_f8.data._M_elems[3];
              local_b8.data._M_elems[2] = local_f8.data._M_elems[2];
              local_b8.data._M_elems[5] = local_f8.data._M_elems[5];
              local_b8.data._M_elems[4] = local_f8.data._M_elems[4];
              local_b8.data._M_elems[7] = local_f8.data._M_elems[7];
              local_b8.data._M_elems[6] = local_f8.data._M_elems[6];
              local_b8.data._M_elems[9] = local_f8.data._M_elems[9];
              local_b8.data._M_elems[8] = local_f8.data._M_elems[8];
              local_b8.exp = local_f8.exp;
              local_b8.neg = local_f8.neg;
              local_b8.fpclass = local_f8.fpclass;
              local_b8.prec_elem = local_f8.prec_elem;
              if (local_f8.fpclass != cpp_dec_float_finite || local_f8.data._M_elems[0] != 0) {
                local_b8.neg = (bool)(local_f8.neg ^ 1);
              }
              local_178.fpclass = cpp_dec_float_finite;
              local_178.prec_elem = 10;
              local_178.data._M_elems[0] = 0;
              local_178.data._M_elems[1] = 0;
              local_178.data._M_elems[2] = 0;
              local_178.data._M_elems[3] = 0;
              local_178.data._M_elems[4] = 0;
              local_178.data._M_elems[5] = 0;
              local_178.data._M_elems._24_5_ = 0;
              local_178.data._M_elems[7]._1_3_ = 0;
              local_178.data._M_elems[8] = 0;
              local_178.data._M_elems[9] = 0;
              local_178.exp = 0;
              local_178.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&local_178,&local_b8,
                         (cpp_dec_float<50U,_int,_void> *)
                         ((long)(this->theLCbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar16));
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_140,&local_178);
            }
          }
          else {
            local_178.data._M_elems[1] = local_138.data._M_elems[1];
            local_178.data._M_elems[0] = local_138.data._M_elems[0];
            local_178.data._M_elems[3] = local_138.data._M_elems[3];
            local_178.data._M_elems[2] = local_138.data._M_elems[2];
            local_178.data._M_elems[5] = local_138.data._M_elems[5];
            local_178.data._M_elems[4] = local_138.data._M_elems[4];
            local_178.data._M_elems[8] = local_138.data._M_elems[8];
            local_178.data._M_elems[9] = local_138.data._M_elems[9];
            local_178.data._M_elems._24_5_ =
                 SUB85(CONCAT44(local_138.data._M_elems[7],local_138.data._M_elems[6]),0);
            local_178.data._M_elems[7]._1_3_ = (undefined3)(local_138.data._M_elems[7] >> 8);
            local_178.exp = local_138.exp;
            local_178.neg = local_138.neg;
            local_178.fpclass = local_138.fpclass;
            local_178.prec_elem = local_138.prec_elem;
            if (local_138.fpclass != cpp_dec_float_finite || local_138.data._M_elems[0] != 0) {
              local_178.neg = (bool)(local_138.neg ^ 1);
            }
            tVar9 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)(this->theUCbound).val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                         data._M_elems + lVar16),
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_178);
            if (tVar9) {
              pcVar15 = (cpp_dec_float<50U,_int,_void> *)
                        ((long)(this->theUCbound).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                        + lVar16);
              local_b8.data._M_elems[1] = local_138.data._M_elems[1];
              local_b8.data._M_elems[0] = local_138.data._M_elems[0];
              local_b8.data._M_elems[3] = local_138.data._M_elems[3];
              local_b8.data._M_elems[2] = local_138.data._M_elems[2];
              local_b8.data._M_elems[5] = local_138.data._M_elems[5];
              local_b8.data._M_elems[4] = local_138.data._M_elems[4];
              local_b8.data._M_elems[7] = local_138.data._M_elems[7];
              local_b8.data._M_elems[6] = local_138.data._M_elems[6];
              local_b8.data._M_elems[9] = local_138.data._M_elems[9];
              local_b8.data._M_elems[8] = local_138.data._M_elems[8];
              local_b8.exp = local_138.exp;
              local_b8.neg = local_138.neg;
              local_b8.fpclass = local_138.fpclass;
              local_b8.prec_elem = local_138.prec_elem;
              if (local_138.fpclass != cpp_dec_float_finite || local_138.data._M_elems[0] != 0) {
                local_b8.neg = (bool)(local_138.neg ^ 1);
              }
              pcVar14 = &local_b8;
            }
            else {
              local_178.data._M_elems[1] = local_f8.data._M_elems[1];
              local_178.data._M_elems[0] = local_f8.data._M_elems[0];
              local_178.data._M_elems[3] = local_f8.data._M_elems[3];
              local_178.data._M_elems[2] = local_f8.data._M_elems[2];
              local_178.data._M_elems[5] = local_f8.data._M_elems[5];
              local_178.data._M_elems[4] = local_f8.data._M_elems[4];
              local_178.data._M_elems[8] = local_f8.data._M_elems[8];
              local_178.data._M_elems[9] = local_f8.data._M_elems[9];
              local_178.data._M_elems._24_5_ =
                   SUB85(CONCAT44(local_f8.data._M_elems[7],local_f8.data._M_elems[6]),0);
              local_178.data._M_elems[7]._1_3_ = (undefined3)(local_f8.data._M_elems[7] >> 8);
              local_178.exp = local_f8.exp;
              local_178.neg = local_f8.neg;
              local_178.fpclass = local_f8.fpclass;
              local_178.prec_elem = local_f8.prec_elem;
              if (local_f8.fpclass != cpp_dec_float_finite || local_f8.data._M_elems[0] != 0) {
                local_178.neg = (bool)(local_f8.neg ^ 1);
              }
              tVar9 = boost::multiprecision::operator<
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)((long)(this->theLCbound).val.
                                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                           data._M_elems + lVar16),
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&local_178);
              if (!tVar9) goto LAB_001ecad2;
              local_b8.data._M_elems[1] = local_f8.data._M_elems[1];
              local_b8.data._M_elems[0] = local_f8.data._M_elems[0];
              local_b8.data._M_elems[3] = local_f8.data._M_elems[3];
              local_b8.data._M_elems[2] = local_f8.data._M_elems[2];
              local_b8.data._M_elems[5] = local_f8.data._M_elems[5];
              local_b8.data._M_elems[4] = local_f8.data._M_elems[4];
              local_b8.data._M_elems[7] = local_f8.data._M_elems[7];
              local_b8.data._M_elems[6] = local_f8.data._M_elems[6];
              local_b8.data._M_elems[9] = local_f8.data._M_elems[9];
              local_b8.data._M_elems[8] = local_f8.data._M_elems[8];
              local_b8.exp = local_f8.exp;
              local_b8.neg = local_f8.neg;
              local_b8.fpclass = local_f8.fpclass;
              local_b8.prec_elem = local_f8.prec_elem;
              if (local_f8.fpclass != cpp_dec_float_finite || local_f8.data._M_elems[0] != 0) {
                local_b8.neg = (bool)(local_f8.neg ^ 1);
              }
              pcVar14 = (cpp_dec_float<50U,_int,_void> *)
                        ((long)(this->theLCbound).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                        + lVar16);
              pcVar15 = &local_b8;
            }
            local_178.fpclass = cpp_dec_float_finite;
            local_178.prec_elem = 10;
            local_178.neg = false;
            local_178.exp = 0;
            local_178.data._M_elems[9] = 0;
            local_178.data._M_elems[8] = 0;
            local_178.data._M_elems[7]._1_3_ = 0;
            local_178.data._M_elems._24_5_ = 0;
            local_178.data._M_elems[4] = 0;
            local_178.data._M_elems[5] = 0;
            local_178.data._M_elems[0] = 0;
            local_178.data._M_elems[1] = 0;
            local_178.data._M_elems[2] = 0;
            local_178.data._M_elems[3] = 0;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_178,pcVar15,pcVar14);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (local_140,&local_178);
          }
LAB_001ecad2:
          lVar16 = lVar16 + -0x38;
        }
      }
      else {
        lVar16 = uVar17 * 0x38;
        while( true ) {
          pcVar14 = &local_138;
          pcVar15 = &local_f8;
          if ((int)uVar17 < 1) break;
          pnVar4 = (this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .right.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar5 = *(undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x20);
          local_138.data._M_elems[8] = (uint)uVar5;
          local_138.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
          puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16);
          uVar5 = *puVar1;
          uVar6 = puVar1[1];
          puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x10);
          uVar7 = *puVar1;
          uVar8 = puVar1[1];
          local_138.data._M_elems[4] = (uint)uVar7;
          local_138.data._M_elems[5] = (uint)((ulong)uVar7 >> 0x20);
          local_138.data._M_elems[6] = (uint)uVar8;
          local_138.data._M_elems[7] = (uint)((ulong)uVar8 >> 0x20);
          local_138.data._M_elems[0] = (uint)uVar5;
          local_138.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
          local_138.data._M_elems[2] = (uint)uVar6;
          local_138.data._M_elems[3] = (uint)((ulong)uVar6 >> 0x20);
          local_138.exp = *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16);
          local_138.neg = *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 4U);
          local_138._48_8_ = *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 8U);
          pnVar4 = (this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .left.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar5 = *(undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x20);
          local_f8.data._M_elems[8] = (uint)uVar5;
          local_f8.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
          puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16);
          uVar5 = *puVar1;
          uVar6 = puVar1[1];
          puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x10);
          uVar7 = *puVar1;
          uVar8 = puVar1[1];
          local_f8.data._M_elems[4] = (uint)uVar7;
          local_f8.data._M_elems[5] = (uint)((ulong)uVar7 >> 0x20);
          local_f8.data._M_elems[6] = (uint)uVar8;
          local_f8.data._M_elems[7] = (uint)((ulong)uVar8 >> 0x20);
          local_f8.data._M_elems[0] = (uint)uVar5;
          local_f8.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
          local_f8.data._M_elems[2] = (uint)uVar6;
          local_f8.data._M_elems[3] = (uint)((ulong)uVar6 >> 0x20);
          local_f8.exp = *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16);
          local_f8.neg = *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 4U);
          local_f8._48_8_ = *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 8U);
          bVar10 = boost::multiprecision::operator==
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)pcVar14,
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)pcVar15);
          if (bVar10) {
            tVar9 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)(this->theURbound).val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                         data._M_elems + lVar16),
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)pcVar14);
            if (tVar9) {
LAB_001ecbec:
              pcVar15 = (cpp_dec_float<50U,_int,_void> *)
                        ((long)(this->theURbound).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                        + lVar16);
            }
            else {
LAB_001ecce5:
              pcVar14 = (cpp_dec_float<50U,_int,_void> *)
                        ((long)(this->theLRbound).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                        + lVar16);
            }
            local_178.fpclass = cpp_dec_float_finite;
            local_178.prec_elem = 10;
            local_178.neg = false;
            local_178.exp = 0;
            local_178.data._M_elems[9] = 0;
            local_178.data._M_elems[8] = 0;
            local_178.data._M_elems[7]._1_3_ = 0;
            local_178.data._M_elems._24_5_ = 0;
            local_178.data._M_elems[4] = 0;
            local_178.data._M_elems[5] = 0;
            local_178.data._M_elems[0] = 0;
            local_178.data._M_elems[1] = 0;
            local_178.data._M_elems[2] = 0;
            local_178.data._M_elems[3] = 0;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_178,pcVar15,pcVar14);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (local_140,&local_178);
          }
          else if (this->theRep *
                   (this->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thedesc.rowstat.data[uVar17 - 1] < 1) {
            pnVar4 = (this->thePvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_178.fpclass = cpp_dec_float_finite;
            local_178.prec_elem = 10;
            local_178.data._M_elems[0] = 0;
            local_178.data._M_elems[1] = 0;
            local_178.data._M_elems[2] = 0;
            local_178.data._M_elems[3] = 0;
            local_178.data._M_elems[4] = 0;
            local_178.data._M_elems[5] = 0;
            local_178.data._M_elems._24_5_ = 0;
            local_178.data._M_elems[7]._1_3_ = 0;
            local_178.data._M_elems[8] = 0;
            local_178.data._M_elems[9] = 0;
            local_178.exp = 0;
            local_178.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_178,pcVar14,&local_68);
            tVar9 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems + lVar16
                                  ),(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&local_178);
            if (tVar9) {
              pnVar4 = (this->theURbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(ulong *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x20) =
                   CONCAT44(local_138.data._M_elems[9],local_138.data._M_elems[8]);
              puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x10);
              *puVar1 = CONCAT44(local_138.data._M_elems[5],local_138.data._M_elems[4]);
              puVar1[1] = CONCAT44(local_138.data._M_elems[7],local_138.data._M_elems[6]);
              puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16);
              *puVar1 = CONCAT44(local_138.data._M_elems[1],local_138.data._M_elems[0]);
              puVar1[1] = CONCAT44(local_138.data._M_elems[3],local_138.data._M_elems[2]);
              *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16) = local_138.exp;
              *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 4U) = local_138.neg;
              *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 8U) =
                   local_138._48_8_;
            }
            else {
              local_178.fpclass = cpp_dec_float_finite;
              local_178.prec_elem = 10;
              local_178.data._M_elems[0] = 0;
              local_178.data._M_elems[1] = 0;
              local_178.data._M_elems[2] = 0;
              local_178.data._M_elems[3] = 0;
              local_178.data._M_elems[4] = 0;
              local_178.data._M_elems[5] = 0;
              local_178.data._M_elems._24_5_ = 0;
              local_178.data._M_elems[7]._1_3_ = 0;
              local_178.data._M_elems[8] = 0;
              local_178.data._M_elems[9] = 0;
              local_178.exp = 0;
              local_178.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&local_178,
                         (cpp_dec_float<50U,_int,_void> *)
                         ((long)(this->theURbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar16),pcVar14);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_140,&local_178);
            }
            pnVar4 = (this->thePvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_178.fpclass = cpp_dec_float_finite;
            local_178.prec_elem = 10;
            local_178.data._M_elems[0] = 0;
            local_178.data._M_elems[1] = 0;
            local_178.data._M_elems[2] = 0;
            local_178.data._M_elems[3] = 0;
            local_178.data._M_elems[4] = 0;
            local_178.data._M_elems[5] = 0;
            local_178.data._M_elems._24_5_ = 0;
            local_178.data._M_elems[7]._1_3_ = 0;
            local_178.data._M_elems[8] = 0;
            local_178.data._M_elems[9] = 0;
            local_178.exp = 0;
            local_178.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_178,&local_f8,&local_68);
            tVar9 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems + lVar16
                                  ),(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&local_178);
            if (tVar9) {
              pnVar4 = (this->theLRbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(ulong *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x20) =
                   CONCAT44(local_f8.data._M_elems[9],local_f8.data._M_elems[8]);
              puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x10);
              *puVar1 = CONCAT44(local_f8.data._M_elems[5],local_f8.data._M_elems[4]);
              puVar1[1] = CONCAT44(local_f8.data._M_elems[7],local_f8.data._M_elems[6]);
              puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16);
              *puVar1 = CONCAT44(local_f8.data._M_elems[1],local_f8.data._M_elems[0]);
              puVar1[1] = CONCAT44(local_f8.data._M_elems[3],local_f8.data._M_elems[2]);
              *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16) = local_f8.exp;
              *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 4U) = local_f8.neg;
              *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 8U) =
                   local_f8._48_8_;
            }
            else {
              local_178.fpclass = cpp_dec_float_finite;
              local_178.prec_elem = 10;
              local_178.data._M_elems[0] = 0;
              local_178.data._M_elems[1] = 0;
              local_178.data._M_elems[2] = 0;
              local_178.data._M_elems[3] = 0;
              local_178.data._M_elems[4] = 0;
              local_178.data._M_elems[5] = 0;
              local_178.data._M_elems._24_5_ = 0;
              local_178.data._M_elems[7]._1_3_ = 0;
              local_178.data._M_elems[8] = 0;
              local_178.data._M_elems[9] = 0;
              local_178.exp = 0;
              local_178.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&local_178,&local_f8,
                         (cpp_dec_float<50U,_int,_void> *)
                         ((long)(this->theLRbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar16));
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_140,&local_178);
            }
          }
          else {
            tVar9 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)(this->theURbound).val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                         data._M_elems + lVar16),
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)pcVar14);
            if (tVar9) goto LAB_001ecbec;
            tVar9 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)(this->theLRbound).val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                         data._M_elems + lVar16),
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)pcVar15);
            if (tVar9) goto LAB_001ecce5;
          }
          uVar17 = uVar17 - 1;
          lVar16 = lVar16 + -0x38;
        }
        uVar17 = (ulong)(uint)(this->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .
                              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .set.thenum;
        lVar16 = uVar17 * 0x38;
        while( true ) {
          pcVar15 = &local_138;
          pcVar14 = &local_f8;
          if ((int)uVar17 < 1) break;
          pnVar4 = (this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .up.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar5 = *(undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x20);
          local_138.data._M_elems[8] = (uint)uVar5;
          local_138.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
          puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16);
          uVar5 = *puVar1;
          uVar6 = puVar1[1];
          puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x10);
          uVar7 = *puVar1;
          uVar8 = puVar1[1];
          local_138.data._M_elems[4] = (uint)uVar7;
          local_138.data._M_elems[5] = (uint)((ulong)uVar7 >> 0x20);
          local_138.data._M_elems[6] = (uint)uVar8;
          local_138.data._M_elems[7] = (uint)((ulong)uVar8 >> 0x20);
          local_138.data._M_elems[0] = (uint)uVar5;
          local_138.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
          local_138.data._M_elems[2] = (uint)uVar6;
          local_138.data._M_elems[3] = (uint)((ulong)uVar6 >> 0x20);
          local_138.exp = *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16);
          local_138.neg = *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 4U);
          local_138._48_8_ = *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 8U);
          pnVar4 = (this->
                   super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .low.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar5 = *(undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x20);
          local_f8.data._M_elems[8] = (uint)uVar5;
          local_f8.data._M_elems[9] = (uint)((ulong)uVar5 >> 0x20);
          puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16);
          uVar5 = *puVar1;
          uVar6 = puVar1[1];
          puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x10);
          uVar7 = *puVar1;
          uVar8 = puVar1[1];
          local_f8.data._M_elems[4] = (uint)uVar7;
          local_f8.data._M_elems[5] = (uint)((ulong)uVar7 >> 0x20);
          local_f8.data._M_elems[6] = (uint)uVar8;
          local_f8.data._M_elems[7] = (uint)((ulong)uVar8 >> 0x20);
          local_f8.data._M_elems[0] = (uint)uVar5;
          local_f8.data._M_elems[1] = (uint)((ulong)uVar5 >> 0x20);
          local_f8.data._M_elems[2] = (uint)uVar6;
          local_f8.data._M_elems[3] = (uint)((ulong)uVar6 >> 0x20);
          local_f8.exp = *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16);
          local_f8.neg = *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 4U);
          local_f8._48_8_ = *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 8U);
          bVar10 = boost::multiprecision::operator==
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)pcVar15,
                              (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)pcVar14);
          if (bVar10) {
            tVar9 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)(this->theUCbound).val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                         data._M_elems + lVar16),
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)pcVar15);
            if (tVar9) {
              pnVar4 = (this->theUCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
LAB_001ecfd0:
              pcVar14 = (cpp_dec_float<50U,_int,_void> *)
                        ((long)pnVar4[-1].m_backend.data._M_elems + lVar16);
            }
            else {
              pcVar15 = (cpp_dec_float<50U,_int,_void> *)
                        ((long)(this->theLCbound).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                        + lVar16);
            }
LAB_001ed106:
            local_178.fpclass = cpp_dec_float_finite;
            local_178.prec_elem = 10;
            local_178.neg = false;
            local_178.exp = 0;
            local_178.data._M_elems[9] = 0;
            local_178.data._M_elems[8] = 0;
            local_178.data._M_elems[7]._1_3_ = 0;
            local_178.data._M_elems._24_5_ = 0;
            local_178.data._M_elems[4] = 0;
            local_178.data._M_elems[5] = 0;
            local_178.data._M_elems[0] = 0;
            local_178.data._M_elems[1] = 0;
            local_178.data._M_elems[2] = 0;
            local_178.data._M_elems[3] = 0;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_178,pcVar14,pcVar15);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (local_140,&local_178);
          }
          else if (this->theRep *
                   (this->
                   super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).thedesc.colstat.data[uVar17 - 1] < 1) {
            pnVar4 = (this->theCoPvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_178.fpclass = cpp_dec_float_finite;
            local_178.prec_elem = 10;
            local_178.data._M_elems[0] = 0;
            local_178.data._M_elems[1] = 0;
            local_178.data._M_elems[2] = 0;
            local_178.data._M_elems[3] = 0;
            local_178.data._M_elems[4] = 0;
            local_178.data._M_elems[5] = 0;
            local_178.data._M_elems._24_5_ = 0;
            local_178.data._M_elems[7]._1_3_ = 0;
            local_178.data._M_elems[8] = 0;
            local_178.data._M_elems[9] = 0;
            local_178.exp = 0;
            local_178.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_178,pcVar15,&local_68);
            tVar9 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems + lVar16
                                  ),(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&local_178);
            if (tVar9) {
              pnVar4 = (this->theUCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(ulong *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x20) =
                   CONCAT44(local_138.data._M_elems[9],local_138.data._M_elems[8]);
              puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x10);
              *puVar1 = CONCAT44(local_138.data._M_elems[5],local_138.data._M_elems[4]);
              puVar1[1] = CONCAT44(local_138.data._M_elems[7],local_138.data._M_elems[6]);
              puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16);
              *puVar1 = CONCAT44(local_138.data._M_elems[1],local_138.data._M_elems[0]);
              puVar1[1] = CONCAT44(local_138.data._M_elems[3],local_138.data._M_elems[2]);
              *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16) = local_138.exp;
              *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 4U) = local_138.neg;
              *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 8U) =
                   local_138._48_8_;
            }
            else {
              local_178.fpclass = cpp_dec_float_finite;
              local_178.prec_elem = 10;
              local_178.data._M_elems[0] = 0;
              local_178.data._M_elems[1] = 0;
              local_178.data._M_elems[2] = 0;
              local_178.data._M_elems[3] = 0;
              local_178.data._M_elems[4] = 0;
              local_178.data._M_elems[5] = 0;
              local_178.data._M_elems._24_5_ = 0;
              local_178.data._M_elems[7]._1_3_ = 0;
              local_178.data._M_elems[8] = 0;
              local_178.data._M_elems[9] = 0;
              local_178.exp = 0;
              local_178.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&local_178,
                         (cpp_dec_float<50U,_int,_void> *)
                         ((long)(this->theUCbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar16),pcVar15);
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_140,&local_178);
            }
            pnVar4 = (this->theCoPvec->
                     super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_178.fpclass = cpp_dec_float_finite;
            local_178.prec_elem = 10;
            local_178.data._M_elems[0] = 0;
            local_178.data._M_elems[1] = 0;
            local_178.data._M_elems[2] = 0;
            local_178.data._M_elems[3] = 0;
            local_178.data._M_elems[4] = 0;
            local_178.data._M_elems[5] = 0;
            local_178.data._M_elems._24_5_ = 0;
            local_178.data._M_elems[7]._1_3_ = 0;
            local_178.data._M_elems[8] = 0;
            local_178.data._M_elems[9] = 0;
            local_178.exp = 0;
            local_178.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&local_178,&local_f8,&local_68);
            tVar9 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)pnVar4[0xffffffffffffffff].m_backend.data._M_elems + lVar16
                                  ),(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                     *)&local_178);
            if (tVar9) {
              pnVar4 = (this->theLCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(ulong *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x20) =
                   CONCAT44(local_f8.data._M_elems[9],local_f8.data._M_elems[8]);
              puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16 + 0x10);
              *puVar1 = CONCAT44(local_f8.data._M_elems[5],local_f8.data._M_elems[4]);
              puVar1[1] = CONCAT44(local_f8.data._M_elems[7],local_f8.data._M_elems[6]);
              puVar1 = (undefined8 *)((long)pnVar4[-1].m_backend.data._M_elems + lVar16);
              *puVar1 = CONCAT44(local_f8.data._M_elems[1],local_f8.data._M_elems[0]);
              puVar1[1] = CONCAT44(local_f8.data._M_elems[3],local_f8.data._M_elems[2]);
              *(int *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16) = local_f8.exp;
              *(bool *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 4U) = local_f8.neg;
              *(undefined8 *)((long)(&pnVar4[-1].m_backend.data + 1) + lVar16 + 8U) =
                   local_f8._48_8_;
            }
            else {
              local_178.fpclass = cpp_dec_float_finite;
              local_178.prec_elem = 10;
              local_178.data._M_elems[0] = 0;
              local_178.data._M_elems[1] = 0;
              local_178.data._M_elems[2] = 0;
              local_178.data._M_elems[3] = 0;
              local_178.data._M_elems[4] = 0;
              local_178.data._M_elems[5] = 0;
              local_178.data._M_elems._24_5_ = 0;
              local_178.data._M_elems[7]._1_3_ = 0;
              local_178.data._M_elems[8] = 0;
              local_178.data._M_elems[9] = 0;
              local_178.exp = 0;
              local_178.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&local_178,&local_f8,
                         (cpp_dec_float<50U,_int,_void> *)
                         ((long)(this->theLCbound).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar16));
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (local_140,&local_178);
            }
          }
          else {
            tVar9 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)(this->theUCbound).val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                         data._M_elems + lVar16),
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)pcVar15);
            if (tVar9) {
              pnVar4 = (this->theUCbound).val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              goto LAB_001ecfd0;
            }
            tVar9 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)((long)(this->theLCbound).val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                         data._M_elems + lVar16),
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_f8);
            if (tVar9) {
              pcVar15 = (cpp_dec_float<50U,_int,_void> *)
                        ((long)(this->theLCbound).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                        + lVar16);
              pcVar14 = &local_f8;
              goto LAB_001ed106;
            }
          }
          uVar17 = uVar17 - 1;
          lVar16 = lVar16 + -0x38;
        }
      }
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::unShift(void)
{
   SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "DSHIFT07 = " << "unshifting ..." << std::endl;);

   if(isInitialized())
   {
      int i;
      R t_up, t_low;
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

      theShift = 0;

      if(type() == ENTER)
      {
         R eps = entertol();

         if(rep() == COLUMN)
         {
            for(i = dim(); i-- > 0;)
            {
               SPxId l_id = this->baseId(i);
               int l_num = this->number(l_id);

               if(l_id.type() == SPxId::ROW_ID)
               {
                  t_up = -this->lhs(l_num);
                  t_low = -this->rhs(l_num);
               }
               else
               {
                  assert(l_id.type() == SPxId::COL_ID);
                  t_up = this->upper(l_num);
                  t_low = this->lower(l_num);
               }

               if(t_up != t_low)
               {
                  if((*theFvec)[i] < t_up + eps)  // check allowed violation
                     theUBbound[i] = t_up; // reset shifted bound to original
                  else if((*theFvec)[i] > t_up)  // shifted bound is required for feasibility
                     theShift += theUBbound[i] - t_up;

                  if((*theFvec)[i] > t_low - eps)  // check allowed violation
                     theLBbound[i] = t_low; // reset shifted bound to original
                  else if((*theFvec)[i] < t_low)  // shifted bound is required for feasibility
                     theShift -= theLBbound[i] - t_low;
               }
               else
               {
                  if(theUBbound[i] > t_up)
                     theShift += theUBbound[i] - t_up;
                  else if(theLBbound[i] < t_low)
                     theShift += t_low - theLBbound[i];
               }
            }

            for(i = this->nRows(); i-- > 0;)
            {
               if(!isBasic(ds.rowStatus(i)))
               {
                  t_up = -this->lhs(i);
                  t_low = -this->rhs(i);

                  if(theURbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theURbound[i] - t_up;

                  if(t_low > theLRbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLRbound[i];
               }
            }

            for(i = this->nCols(); i-- > 0;)
            {
               if(!isBasic(ds.colStatus(i)))
               {
                  t_up = this->upper(i);
                  t_low = this->lower(i);

                  if(theUCbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theUCbound[i] - t_up;

                  if(t_low > theLCbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLCbound[i];
               }
            }
         }
         else
         {
            assert(rep() == ROW);

            for(i = dim(); i-- > 0;)
            {
               SPxId l_id = this->baseId(i);
               int l_num = this->number(l_id);
               t_up = t_low = 0;

               if(l_id.type() == SPxId::ROW_ID)
                  clearDualBounds(ds.rowStatus(l_num), t_up, t_low);
               else
                  clearDualBounds(ds.colStatus(l_num), t_up, t_low);

               if(theUBbound[i] != theLBbound[i])
               {
                  if(theUBbound[i] > t_up)
                     theShift += theUBbound[i] - t_up;
                  else
                     theShift -= theUBbound[i] - t_up;
               }
               else
               {
                  /* if the basic (primal or dual) variable is fixed (e.g., basis status P_FREE in row representation)
                   * then shiftFvec() and shiftPvec() do not relax the bounds, but shift both, hence they may be outside
                   * of [t_low,t_up] */
                  assert(theLBbound[i] == theUBbound[i] || theUBbound[i] >= t_up);
                  assert(theLBbound[i] == theUBbound[i] || theLBbound[i] <= t_low);

                  if((*theFvec)[i] < t_up - eps)
                     theUBbound[i] = t_up;
                  else if((*theFvec)[i] > t_up)
                     theShift += theUBbound[i] - t_up;

                  if((*theFvec)[i] > t_low + eps)
                     theLBbound[i] = t_low;
                  else if((*theFvec)[i] < t_low)
                     theShift -= theLBbound[i] - t_low;
               }
            }

            for(i = this->nRows(); i-- > 0;)
            {
               if(!isBasic(ds.rowStatus(i)))
               {
                  t_up = t_low = 0;
                  clearDualBounds(ds.rowStatus(i), t_up, t_low);

                  if(theURbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theURbound[i] - t_up;

                  if(t_low > theLRbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLRbound[i];
               }
            }

            for(i = this->nCols(); i-- > 0;)
            {
               if(!isBasic(ds.colStatus(i)))
               {
                  t_up = t_low = 0;
                  clearDualBounds(ds.colStatus(i), t_up, t_low);

                  if(theUCbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theUCbound[i] - t_up;

                  if(t_low > theLCbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLCbound[i];
               }
            }
         }
      }
      else
      {
         assert(type() == LEAVE);

         R eps = leavetol();

         if(rep() == COLUMN)
         {
            for(i = this->nRows(); i-- > 0;)
            {
               t_up = t_low = this->maxRowObj(i);
               clearDualBounds(ds.rowStatus(i), t_up, t_low);

               if(!isBasic(ds.rowStatus(i)))
               {
                  if((*theCoPvec)[i] < t_up + eps)
                  {
                     theURbound[i] = t_up; // reset bound to original value

                     if(t_up == t_low)
                        theLRbound[i] = t_low; // for fixed rows we change both bounds
                  }
                  else
                     theShift += theURbound[i] - t_up;

                  if((*theCoPvec)[i] > t_low - eps)
                  {
                     theLRbound[i] = t_low; // reset bound to original value

                     if(t_up == t_low)
                        theURbound[i] = t_up; // for fixed rows we change both bounds
                  }
                  else
                     theShift += t_low - theLRbound[i];
               }
               else if(theURbound[i] > t_up)
                  theShift += theURbound[i] - t_up;
               else if(theLRbound[i] < t_low)
                  theShift += t_low - theLRbound[i];
            }

            for(i = this->nCols(); i-- > 0;)
            {
               t_up = t_low = -this->maxObj(i);
               clearDualBounds(ds.colStatus(i), t_low, t_up);

               if(!isBasic(ds.colStatus(i)))
               {
                  if((*thePvec)[i] < -t_up + eps)
                  {
                     theUCbound[i] = -t_up; // reset bound to original value

                     if(t_up == t_low)
                        theLCbound[i] = -t_low; // for fixed variables we change both bounds
                  }
                  else
                     theShift += theUCbound[i] - (-t_up);

                  if((*thePvec)[i] > -t_low - eps)
                  {
                     theLCbound[i] = -t_low; // reset bound to original value

                     if(t_up == t_low)
                        theUCbound[i] = -t_up; // for fixed variables we change both bounds
                  }
                  else
                     theShift += (-t_low) - theLCbound[i];
               }
               else if(theUCbound[i] > -t_up)
                  theShift += theUCbound[i] - (-t_up);
               else if(theLCbound[i] < -t_low)
                  theShift += (-t_low) - theLCbound[i];
            }
         }
         else
         {
            assert(rep() == ROW);

            for(i = this->nRows(); i-- > 0;)
            {
               t_up = this->rhs(i);
               t_low = this->lhs(i);

               if(t_up == t_low)
               {
                  if(theURbound[i] > t_up)
                     theShift += theURbound[i] - t_up;
                  else
                     theShift += t_low - theLRbound[i];
               }
               else if(!isBasic(ds.rowStatus(i)))
               {
                  if((*thePvec)[i] < t_up + eps)
                     theURbound[i] = t_up; // reset bound to original value
                  else
                     theShift += theURbound[i] - t_up;

                  if((*thePvec)[i] > t_low - eps)
                     theLRbound[i] = t_low; // reset bound to original value
                  else
                     theShift += t_low - theLRbound[i];
               }
               else if(theURbound[i] > t_up)
                  theShift += theURbound[i] - t_up;
               else if(theLRbound[i] < t_low)
                  theShift += t_low - theLRbound[i];
            }

            for(i = this->nCols(); i-- > 0;)
            {
               t_up = this->upper(i);
               t_low = this->lower(i);

               if(t_up == t_low)
               {
                  if(theUCbound[i] > t_up)
                     theShift += theUCbound[i] - t_up;
                  else
                     theShift += t_low - theLCbound[i];
               }
               else if(!isBasic(ds.colStatus(i)))
               {
                  if((*theCoPvec)[i] < t_up + eps)
                     theUCbound[i] = t_up; // reset bound to original value
                  else
                     theShift += theUCbound[i] - t_up;

                  if((*theCoPvec)[i] > t_low - eps)
                     theLCbound[i] = t_low; // reset bound to original value
                  else
                     theShift += t_low - theLCbound[i];
               }
               else if(theUCbound[i] > t_up)
                  theShift += theUCbound[i] - t_up;
               else if(theLCbound[i] < t_low)
                  theShift += t_low - theLCbound[i];
            }
         }
      }
   }
}